

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

void draw_frame(void)

{
  attr_t attrs;
  attr_t frame_attr;
  
  if (ui_flags.draw_frame != '\0') {
    attrs = frame_hp_color();
    nh_box_mvwvline((WINDOW *)basewin,L'\x01',L'\0',ui_flags.viewheight,attrs);
    nh_box_mvwvline((WINDOW *)basewin,L'\x01',L'Q',ui_flags.viewheight,attrs);
    nh_box_mvwadd_ulcorner((WINDOW *)basewin,L'\0',L'\0',attrs);
    nh_box_whline((WINDOW *)basewin,L'P',attrs);
    nh_box_mvwadd_urcorner((WINDOW *)basewin,L'\0',L'Q',attrs);
    nh_box_mvwadd_ltee((WINDOW *)basewin,ui_flags.msgheight + L'\x01',L'\0',attrs);
    nh_box_whline((WINDOW *)basewin,L'P',attrs);
    nh_box_mvwadd_rtee((WINDOW *)basewin,ui_flags.msgheight + L'\x01',L'Q',attrs);
    nh_box_mvwadd_ltee((WINDOW *)basewin,ui_flags.msgheight + L'\x17',L'\0',attrs);
    nh_box_whline((WINDOW *)basewin,L'P',attrs);
    nh_box_mvwadd_rtee((WINDOW *)basewin,ui_flags.msgheight + L'\x17',L'Q',attrs);
    nh_box_mvwadd_llcorner((WINDOW *)basewin,ui_flags.viewheight + L'\x01',L'\0',attrs);
    nh_box_whline((WINDOW *)basewin,L'P',attrs);
    nh_box_mvwadd_lrcorner((WINDOW *)basewin,ui_flags.viewheight + L'\x01',L'Q',attrs);
    if (ui_flags.draw_sidebar != '\0') {
      nh_box_mvwadd_ttee((WINDOW *)basewin,L'\0',L'Q',attrs);
      nh_box_whline((WINDOW *)basewin,_COLS + L'\xffffffad',attrs);
      nh_box_mvwadd_urcorner((WINDOW *)basewin,L'\0',_COLS + L'\xffffffff',attrs);
      nh_box_mvwadd_btee((WINDOW *)basewin,ui_flags.viewheight + L'\x01',L'Q',attrs);
      nh_box_whline((WINDOW *)basewin,_COLS + L'\xffffffad',attrs);
      nh_box_mvwadd_lrcorner
                ((WINDOW *)basewin,ui_flags.viewheight + L'\x01',_COLS + L'\xffffffff',attrs);
      nh_box_mvwvline((WINDOW *)basewin,L'\x01',_COLS + L'\xffffffff',ui_flags.viewheight,attrs);
    }
  }
  return;
}

Assistant:

static void draw_frame(void)
{
    attr_t frame_attr;

    if (!ui_flags.draw_frame)
	return;

    frame_attr = frame_hp_color();

    /* vertical lines */
    nh_box_mvwvline(basewin, 1, 0, ui_flags.viewheight, frame_attr);
    nh_box_mvwvline(basewin, 1, COLNO + 1, ui_flags.viewheight, frame_attr);

    /* horizontal top line above the message win */
    nh_box_mvwadd_ulcorner(basewin, 0, 0, frame_attr);
    nh_box_whline(basewin, COLNO, frame_attr);
    nh_box_mvwadd_urcorner(basewin, 0, COLNO + 1, frame_attr);

    /* horizontal line between message and map windows */
    nh_box_mvwadd_ltee(basewin, 1 + ui_flags.msgheight, 0, frame_attr);
    nh_box_whline(basewin, COLNO, frame_attr);
    nh_box_mvwadd_rtee(basewin, 1 + ui_flags.msgheight, COLNO + 1, frame_attr);

    /* horizontal line between map and status */
    nh_box_mvwadd_ltee(basewin, 2 + ui_flags.msgheight + ROWNO, 0, frame_attr);
    nh_box_whline(basewin, COLNO, frame_attr);
    nh_box_mvwadd_rtee(basewin, 2 + ui_flags.msgheight + ROWNO, COLNO + 1, frame_attr);

    /* horizontal bottom line */
    nh_box_mvwadd_llcorner(basewin, ui_flags.viewheight + 1, 0, frame_attr);
    nh_box_whline(basewin, COLNO, frame_attr);
    nh_box_mvwadd_lrcorner(basewin, ui_flags.viewheight + 1, COLNO + 1, frame_attr);

    if (ui_flags.draw_sidebar) {
	nh_box_mvwadd_ttee(basewin, 0, COLNO + 1, frame_attr);
	nh_box_whline(basewin, COLS - COLNO - 3, frame_attr);
	nh_box_mvwadd_urcorner(basewin, 0, COLS - 1, frame_attr);

	nh_box_mvwadd_btee(basewin, ui_flags.viewheight + 1, COLNO + 1, frame_attr);
	nh_box_whline(basewin, COLS - COLNO - 3, frame_attr);
	nh_box_mvwadd_lrcorner(basewin, ui_flags.viewheight + 1, COLS - 1, frame_attr);

	nh_box_mvwvline(basewin, 1, COLS - 1, ui_flags.viewheight, frame_attr);
    }
}